

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O2

void work_lda_fxc_pol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  double __x;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  undefined1 auVar200 [16];
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  undefined1 auVar211 [16];
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  undefined1 auVar224 [16];
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  undefined1 auVar234 [16];
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  undefined1 auVar242 [16];
  double dVar245;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  undefined1 auVar260 [16];
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double local_df0;
  double local_cf8;
  double local_af8;
  double local_958;
  double local_790;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_498;
  double local_488;
  double dStack_480;
  double local_468;
  double dStack_460;
  double local_458;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  double local_3f8;
  double local_3c8;
  double dStack_3c0;
  double local_3a8;
  double local_368;
  double dStack_360;
  
  local_790 = 0.0;
  for (sVar4 = 0; np != sVar4; sVar4 = sVar4 + 1) {
    lVar3 = (long)(p->dim).rho * sVar4;
    dVar77 = rho[lVar3];
    if (p->nspin == 2) {
      dVar77 = dVar77 + rho[lVar3 + 1];
    }
    dVar187 = p->dens_threshold;
    if (dVar187 <= dVar77) {
      if ((p->nspin == 2) && (local_790 = rho[lVar3 + 1], rho[lVar3 + 1] <= dVar187)) {
        local_790 = dVar187;
      }
      dVar77 = rho[lVar3];
      if (rho[lVar3] <= dVar187) {
        dVar77 = dVar187;
      }
      dVar9 = cbrt(0.3183098861837907);
      dVar10 = dVar9 * 1.4422495703074083;
      dVar11 = dVar10 * 2.519842099789747;
      dVar114 = dVar77 - local_790;
      dVar77 = dVar77 + local_790;
      dVar78 = 1.0 / dVar77;
      dVar115 = dVar114 * dVar78 + 1.0;
      dVar187 = p->zeta_threshold;
      dVar12 = cbrt(dVar187);
      dVar13 = cbrt(dVar115);
      local_cf8 = dVar187 * dVar12;
      dVar14 = local_cf8;
      if (dVar187 < dVar115) {
        dVar14 = dVar13 * dVar115;
      }
      dVar15 = dVar14 * 1.5874010519681996;
      dVar16 = cbrt(dVar77);
      dVar17 = cbrt(9.0);
      dVar79 = dVar9 * dVar9;
      dVar18 = dVar17 * dVar17 * dVar79;
      dVar80 = p->cam_omega * dVar18;
      dVar116 = 1.0 / dVar16;
      dVar117 = dVar116 * 1.4422495703074083;
      uVar5 = -(ulong)(dVar115 <= dVar187);
      dVar67 = (double)(uVar5 & (ulong)dVar12 | ~uVar5 & (ulong)dVar13);
      dVar19 = 1.0 / dVar67;
      dVar118 = (dVar117 * dVar19 * dVar80) / 18.0;
      dVar17 = 1.92;
      if (dVar118 <= 1.92) {
        dVar17 = dVar118;
      }
      dVar20 = atan2(1.0,dVar17);
      dVar81 = dVar17 * dVar17;
      dVar21 = 1.0 / dVar81;
      dVar22 = dVar21 + 1.0;
      dVar23 = log(dVar22);
      dVar100 = dVar118;
      if (dVar118 <= 1.92) {
        dVar100 = 1.92;
      }
      dVar225 = dVar100 * dVar100;
      dVar274 = dVar225 * dVar225;
      dVar168 = dVar274 * dVar274;
      dVar261 = dVar274 * dVar225;
      dVar272 = dVar168 * dVar168;
      dVar24 = 1.0 / (dVar168 * dVar225);
      auVar224._0_8_ = dVar261 * dVar168;
      auVar224._8_8_ = dVar272;
      auVar242 = divpd(_DAT_00f4add0,auVar224);
      dVar245 = auVar242._8_8_;
      auVar150._8_8_ = dVar245;
      auVar150._0_8_ = dVar245;
      auVar69._8_8_ = dVar245;
      auVar69._0_8_ = dVar245;
      auVar149._8_8_ = dVar274 * dVar168;
      auVar149._0_8_ = dVar168 * dVar225;
      auVar149 = divpd(auVar69,auVar149);
      dVar253 = 1.0 / (dVar274 * dVar168);
      auVar200._0_8_ = dVar168 * dVar261;
      auVar200._8_8_ = dVar272 * dVar272;
      auVar251._8_8_ = dVar168;
      auVar251._0_8_ = dVar261;
      auVar72._8_8_ = dVar245;
      auVar72._0_8_ = dVar245;
      auVar224 = divpd(auVar72,auVar251);
      auVar70._8_8_ = 0x3ff0000000000000;
      auVar70._0_8_ = dVar245;
      auVar200 = divpd(auVar70,auVar200);
      auVar211._8_8_ = dVar274;
      auVar211._0_8_ = dVar225;
      auVar251 = divpd(auVar150,auVar211);
      dVar201 = auVar200._8_8_;
      auVar71._8_8_ = dVar201;
      auVar71._0_8_ = dVar201;
      auVar68._8_8_ = dVar274;
      auVar68._0_8_ = dVar225;
      auVar211 = divpd(auVar71,auVar68);
      dVar272 = dVar81 + 3.0;
      dVar82 = 1.0 - dVar23 * dVar272;
      dVar20 = dVar17 * dVar82 * 0.25 + dVar20;
      dVar83 = 1.0 / dVar274;
      dVar178 = 1.0 / dVar261;
      dVar119 = 1.0 / dVar168;
      if (dVar118 < 1.92) {
        local_af8 = dVar20 * -2.6666666666666665 * dVar17 + 1.0;
      }
      else {
        auVar68 = divpd(auVar242,_DAT_00f643f0);
        auVar69 = divpd(auVar251,_DAT_00f64400);
        auVar70 = divpd(auVar224,_DAT_00f64410);
        auVar150 = divpd(auVar149,_DAT_00f64420);
        auVar71 = divpd(auVar200,_DAT_00f64430);
        auVar72 = divpd(auVar211,_DAT_00f64440);
        local_af8 = (((((((((((dVar253 / -364.0 +
                               dVar24 / 231.0 +
                               dVar119 / -135.0 +
                               dVar178 / 70.0 + dVar83 / -30.0 + (1.0 / dVar225) / 9.0 +
                              auVar68._0_8_) - auVar68._8_8_) + auVar69._0_8_) - auVar69._8_8_) +
                          auVar70._0_8_) - auVar70._8_8_) + auVar150._0_8_) - auVar150._8_8_) +
                      auVar71._0_8_) - auVar71._8_8_) + auVar72._0_8_) - auVar72._8_8_;
      }
      __x = 1.0 - dVar114 * dVar78;
      dVar1 = p->zeta_threshold;
      dVar25 = cbrt(__x);
      if (dVar1 < __x) {
        local_cf8 = __x * dVar25;
      }
      dVar120 = local_cf8 * 1.5874010519681996;
      uVar6 = -(ulong)(__x <= dVar1);
      dVar113 = (double)((ulong)dVar12 & uVar6 | ~uVar6 & (ulong)dVar25);
      dVar26 = 1.0 / dVar113;
      dVar121 = (dVar117 * dVar26 * dVar80) / 18.0;
      dVar12 = 1.92;
      if (dVar121 <= 1.92) {
        dVar12 = dVar121;
      }
      dVar27 = atan2(1.0,dVar12);
      dVar84 = dVar12 * dVar12;
      dVar28 = 1.0 / dVar84;
      dVar29 = dVar28 + 1.0;
      dVar30 = log(dVar29);
      dVar134 = dVar121;
      if (dVar121 <= 1.92) {
        dVar134 = 1.92;
      }
      dVar202 = dVar134 * dVar134;
      dVar275 = dVar202 * dVar202;
      dVar188 = dVar275 * dVar275;
      dVar262 = dVar275 * dVar202;
      dVar273 = dVar188 * dVar188;
      dVar31 = 1.0 / (dVar188 * dVar202);
      auVar177._0_8_ = dVar262 * dVar188;
      auVar177._8_8_ = dVar273;
      auVar68 = divpd(_DAT_00f4add0,auVar177);
      dVar167 = auVar68._8_8_;
      auVar260._8_8_ = dVar167;
      auVar260._0_8_ = dVar167;
      auVar176._8_8_ = dVar167;
      auVar176._0_8_ = dVar167;
      auVar73._8_8_ = dVar275 * dVar188;
      auVar73._0_8_ = dVar188 * dVar202;
      auVar69 = divpd(auVar176,auVar73);
      dVar179 = 1.0 / (dVar275 * dVar188);
      auVar76._0_8_ = dVar188 * dVar262;
      auVar76._8_8_ = dVar273 * dVar273;
      auVar244._8_8_ = dVar188;
      auVar244._0_8_ = dVar262;
      auVar252._8_8_ = dVar167;
      auVar252._0_8_ = dVar167;
      auVar72 = divpd(auVar252,auVar244);
      auVar234._8_8_ = 0x3ff0000000000000;
      auVar234._0_8_ = dVar167;
      auVar70 = divpd(auVar234,auVar76);
      auVar74._8_8_ = dVar275;
      auVar74._0_8_ = dVar202;
      auVar150 = divpd(auVar260,auVar74);
      dVar235 = auVar70._8_8_;
      auVar243._8_8_ = dVar235;
      auVar243._0_8_ = dVar235;
      auVar75._8_8_ = dVar275;
      auVar75._0_8_ = dVar202;
      auVar71 = divpd(auVar243,auVar75);
      dVar273 = dVar84 + 3.0;
      dVar85 = 1.0 - dVar30 * dVar273;
      dVar27 = dVar12 * dVar85 * 0.25 + dVar27;
      dVar86 = 1.0 / dVar275;
      dVar212 = 1.0 / dVar262;
      dVar122 = 1.0 / dVar188;
      if (dVar121 < 1.92) {
        dVar180 = dVar27 * -2.6666666666666665 * dVar12 + 1.0;
      }
      else {
        auVar73 = divpd(auVar68,_DAT_00f643f0);
        auVar74 = divpd(auVar150,_DAT_00f64400);
        auVar75 = divpd(auVar72,_DAT_00f64410);
        auVar177 = divpd(auVar69,_DAT_00f64420);
        auVar76 = divpd(auVar70,_DAT_00f64430);
        auVar244 = divpd(auVar71,_DAT_00f64440);
        dVar180 = (((((((((((dVar179 / -364.0 +
                             dVar31 / 231.0 +
                             dVar122 / -135.0 +
                             dVar212 / 70.0 + dVar86 / -30.0 + (1.0 / dVar202) / 9.0 + auVar73._0_8_
                            ) - auVar73._8_8_) + auVar74._0_8_) - auVar74._8_8_) + auVar75._0_8_) -
                       auVar75._8_8_) + auVar177._0_8_) - auVar177._8_8_) + auVar76._0_8_) -
                   auVar76._8_8_) + auVar244._0_8_) - auVar244._8_8_;
      }
      dVar123 = dVar16 * dVar180;
      dVar151 = dVar116 * 2.519842099789747 * dVar10;
      dVar32 = dVar151 * 0.053425 + 1.0;
      dVar169 = SQRT(dVar151);
      local_df0 = dVar169;
      if (dVar151 < 0.0) {
        local_df0 = sqrt(dVar151);
      }
      dVar33 = dVar16 * local_af8;
      if (dVar151 < 0.0) {
        dVar169 = sqrt(dVar151);
      }
      dVar169 = dVar169 * dVar151;
      dVar124 = dVar79 * 2.080083823051904;
      dVar87 = 1.0 / (dVar16 * dVar16);
      dVar88 = dVar87 * 1.5874010519681996 * dVar124;
      dVar89 = dVar88 * 0.123235 + dVar169 * 0.204775 + local_df0 * 3.79785 + dVar151 * 0.8969;
      dVar34 = 16.081979498692537 / dVar89 + 1.0;
      dVar35 = log(dVar34);
      dVar36 = dVar35 * 0.0621814 * dVar32;
      dVar90 = dVar114 * dVar114;
      dVar91 = dVar90 * dVar90;
      dVar37 = dVar77 * dVar77;
      dVar38 = 1.0 / (dVar37 * dVar37);
      dVar92 = dVar91 * dVar38;
      dVar14 = (dVar14 + local_cf8 + -2.0) * 1.9236610509315362;
      dVar39 = dVar151 * 0.05137 + 1.0;
      dVar93 = dVar88 * 0.1562925 + dVar169 * 0.420775 + local_df0 * 7.05945 + dVar151 * 1.549425;
      dVar40 = 32.16395899738507 / dVar93 + 1.0;
      dVar41 = log(dVar40);
      dVar94 = dVar151 * 0.0278125 + 1.0;
      dVar95 = dVar88 * 0.1241775 + dVar169 * 0.1100325 + local_df0 * 5.1785 + dVar151 * 0.905775;
      dVar169 = 29.608749977793437 / dVar95 + 1.0;
      dVar42 = log(dVar169);
      dVar125 = dVar94 * dVar42 * -0.0197516734986138 + dVar41 * -0.0310907 * dVar39 + dVar36;
      dVar43 = dVar14 * dVar125;
      dVar96 = dVar94 * dVar42 * 0.0197516734986138;
      dVar97 = dVar96 * dVar14 + (dVar43 * dVar92 - dVar36);
      dVar88 = dVar88 * 0.25 + dVar151 * -0.225 + 3.2;
      dVar36 = 1.0 / dVar88;
      dVar126 = (dVar33 * -0.09375 * dVar15 * dVar11 - dVar123 * 0.09375 * dVar120 * dVar11) +
                dVar36 * 3.4602 * dVar97;
      pdVar2 = out->zk;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar3 = (long)(p->dim).zk * sVar4;
        pdVar2[lVar3] = pdVar2[lVar3] + dVar126;
      }
      dVar44 = 1.0 / dVar37;
      dVar45 = dVar78 - dVar114 * dVar44;
      dVar127 = 0.0;
      if (dVar187 < dVar115) {
        dVar127 = dVar45 * 1.3333333333333333 * dVar13;
      }
      dVar46 = dVar127 * 1.5874010519681996;
      dVar128 = dVar87 * local_af8;
      dVar47 = dVar15 * dVar128 * dVar11;
      dVar48 = dVar47 * 0.03125;
      dVar225 = dVar225 * dVar100;
      dVar49 = dVar116 / dVar77;
      dVar50 = dVar49 * 1.4422495703074083;
      dVar152 = 1.0 / (dVar67 * dVar67);
      dVar140 = 1.0 / (dVar13 * dVar13);
      dVar141 = (double)(~uVar5 & (ulong)((dVar45 * dVar140) / 3.0));
      dVar189 = (dVar19 * dVar50 * dVar80) / -54.0;
      dVar153 = (dVar117 * dVar152 * dVar141 * dVar80) / -18.0 + dVar189;
      uVar7 = -(ulong)(1.92 < dVar118);
      dVar98 = (double)(uVar7 & (ulong)dVar153);
      dVar51 = dVar100 * dVar274;
      dVar274 = dVar274 * dVar225;
      dVar213 = 0.0;
      if (dVar118 <= 1.92) {
        dVar213 = dVar153;
      }
      dVar263 = 1.0 / dVar225;
      dVar154 = 1.0 / dVar274;
      dVar155 = 1.0 / (dVar100 * dVar168);
      dVar181 = 1.0 / (dVar225 * dVar168);
      dVar182 = 1.0 / (dVar168 * dVar51);
      dVar236 = 1.0 / (dVar168 * dVar274);
      dVar203 = dVar245 / dVar100;
      dVar204 = dVar245 / dVar274;
      dVar170 = dVar245 / (dVar100 * dVar168);
      dVar153 = dVar245 / (dVar225 * dVar168);
      dVar99 = dVar245 / (dVar168 * dVar51);
      dVar205 = dVar245 / (dVar168 * dVar274);
      dVar100 = dVar201 / dVar100;
      dVar142 = dVar245 / dVar225;
      dVar225 = dVar201 / dVar225;
      dVar129 = 1.0 / dVar51;
      dVar214 = dVar245 / dVar51;
      dVar51 = dVar201 / dVar51;
      dVar246 = 1.0 / (dVar17 * dVar81);
      dVar274 = 1.0 / dVar22;
      dVar130 = dVar272 * dVar246;
      dVar247 = dVar213 * dVar274;
      dVar23 = dVar23 * -2.0;
      dVar168 = dVar23 * dVar213 * dVar17 + dVar130 * (dVar247 + dVar247);
      dVar248 = dVar17 * dVar168 * 0.25 + (dVar213 * dVar82 * 0.25 - dVar21 * dVar274 * dVar213);
      if (dVar118 < 1.92) {
        dVar131 = dVar20 * -2.6666666666666665 * dVar213 + dVar248 * -2.6666666666666665 * dVar17;
      }
      else {
        dVar131 = dVar98 * 0.005120910384068279 * dVar51 +
                  dVar98 * -0.0056808688387635755 * dVar225 +
                  dVar98 * 0.006337888690829867 * dVar100 +
                  dVar98 * -0.007115749525616698 * dVar205 +
                  dVar98 * 0.008045977011494253 * dVar99 +
                  dVar98 * -0.009171075837742505 * dVar153 +
                  dVar98 * 0.01054945054945055 * dVar170 +
                  dVar98 * -0.012263099219620958 * dVar204 +
                  dVar98 * 0.01443001443001443 * dVar214 +
                  dVar98 * -0.01722488038277512 * dVar142 +
                  dVar98 * 0.02091503267973856 * dVar203 +
                  dVar98 * -0.025925925925925925 * dVar236 +
                  dVar98 * 0.03296703296703297 * dVar182 +
                  dVar98 * -0.04329004329004329 * dVar181 +
                  dVar98 * 0.05925925925925926 * dVar155 +
                  dVar98 * -0.08571428571428572 * dVar154 +
                  dVar98 * -0.2222222222222222 * dVar263 + dVar98 * 0.13333333333333333 * dVar129;
      }
      dVar101 = 1.0 / (dVar25 * dVar25);
      dVar183 = 0.0;
      if (dVar1 < __x) {
        dVar183 = (dVar101 * dVar45) / -3.0;
      }
      dVar52 = dVar16 * dVar131;
      dVar132 = (double)(~uVar6 & (ulong)(dVar45 * -1.3333333333333333 * dVar25));
      dVar53 = dVar132 * 1.5874010519681996;
      dVar133 = dVar87 * dVar180;
      dVar54 = dVar120 * dVar133 * dVar11;
      dVar55 = dVar54 * 0.03125;
      dVar202 = dVar202 * dVar134;
      dVar156 = 1.0 / (dVar113 * dVar113);
      dVar226 = (dVar50 * dVar26 * dVar80) / -54.0;
      dVar157 = (dVar117 * dVar156 * dVar183 * dVar80) / -18.0 + dVar226;
      uVar8 = -(ulong)(1.92 < dVar121);
      dVar102 = (double)(uVar8 & (ulong)dVar157);
      dVar56 = dVar134 * dVar275;
      dVar275 = dVar275 * dVar202;
      dVar171 = 0.0;
      if (dVar121 <= 1.92) {
        dVar171 = dVar157;
      }
      dVar276 = 1.0 / dVar202;
      dVar158 = 1.0 / dVar275;
      dVar215 = 1.0 / (dVar134 * dVar188);
      dVar249 = 1.0 / (dVar202 * dVar188);
      dVar190 = 1.0 / (dVar188 * dVar56);
      dVar191 = 1.0 / (dVar188 * dVar275);
      dVar264 = dVar167 / dVar134;
      dVar265 = dVar167 / dVar275;
      dVar206 = dVar167 / (dVar134 * dVar188);
      dVar157 = dVar167 / (dVar202 * dVar188);
      dVar103 = dVar167 / (dVar188 * dVar56);
      dVar266 = dVar167 / (dVar188 * dVar275);
      dVar134 = dVar235 / dVar134;
      dVar207 = dVar167 / dVar202;
      dVar202 = dVar235 / dVar202;
      dVar143 = 1.0 / dVar56;
      dVar237 = dVar167 / dVar56;
      dVar56 = dVar235 / dVar56;
      dVar254 = 1.0 / (dVar12 * dVar84);
      dVar227 = 1.0 / dVar29;
      dVar275 = dVar273 * dVar254;
      dVar255 = dVar227 * dVar171;
      dVar30 = dVar30 * -2.0;
      dVar188 = dVar30 * dVar171 * dVar12 + dVar275 * (dVar255 + dVar255);
      dVar256 = dVar12 * dVar188 * 0.25 + (dVar85 * dVar171 * 0.25 - dVar28 * dVar227 * dVar171);
      if (dVar121 < 1.92) {
        dVar144 = dVar256 * -2.6666666666666665 * dVar12 + dVar27 * -2.6666666666666665 * dVar171;
      }
      else {
        dVar144 = dVar102 * 0.005120910384068279 * dVar56 +
                  dVar102 * -0.0056808688387635755 * dVar202 +
                  dVar102 * 0.006337888690829867 * dVar134 +
                  dVar102 * -0.007115749525616698 * dVar266 +
                  dVar102 * 0.008045977011494253 * dVar103 +
                  dVar102 * -0.009171075837742505 * dVar157 +
                  dVar102 * 0.01054945054945055 * dVar206 +
                  dVar102 * -0.012263099219620958 * dVar265 +
                  dVar102 * 0.01443001443001443 * dVar237 +
                  dVar102 * -0.01722488038277512 * dVar207 +
                  dVar102 * 0.02091503267973856 * dVar264 +
                  dVar102 * -0.025925925925925925 * dVar191 +
                  dVar102 * 0.03296703296703297 * dVar190 +
                  dVar102 * -0.04329004329004329 * dVar249 +
                  dVar102 * 0.05925925925925926 * dVar215 +
                  dVar102 * -0.08571428571428572 * dVar158 +
                  dVar102 * -0.2222222222222222 * dVar276 + dVar102 * 0.13333333333333333 * dVar143;
      }
      dVar57 = dVar15 * dVar52 * dVar11;
      dVar228 = dVar53 * dVar123 * dVar11;
      dVar58 = dVar46 * dVar33 * dVar11;
      dVar59 = dVar16 * dVar144;
      dVar104 = dVar120 * dVar59 * dVar11;
      dVar60 = dVar104 * 0.09375;
      dVar135 = dVar49 * 2.519842099789747;
      dVar257 = dVar35 * 0.0011073470983333333 * dVar135 * dVar10;
      dVar61 = dVar89 * dVar89;
      dVar62 = dVar32 * (1.0 / dVar61);
      dVar9 = dVar9 * 2.519842099789747;
      dVar63 = dVar9 * dVar49 * (1.4422495703074083 / local_df0);
      dVar64 = dVar10 * dVar135;
      if (dVar151 < 0.0) {
        dVar136 = sqrt(dVar151);
      }
      else {
        dVar136 = SQRT(dVar151);
      }
      dVar145 = dVar9 * dVar49 * dVar136 * 1.4422495703074083;
      dVar159 = dVar87 / dVar77;
      dVar160 = dVar159 * 1.5874010519681996 * dVar124;
      dVar105 = dVar160 * -0.08215666666666667 +
                dVar145 * -0.1023875 + dVar63 * -0.632975 + dVar64 * -0.29896666666666666;
      dVar172 = 1.0 / dVar34;
      dVar229 = 1.0 / (dVar37 * dVar37 * dVar77);
      dVar106 = dVar93 * dVar93;
      dVar137 = dVar39 * (1.0 / dVar106);
      dVar107 = dVar160 * -0.104195 + dVar145 * -0.2103875 + dVar63 * -1.176575 + dVar64 * -0.516475
      ;
      dVar184 = 1.0 / dVar40;
      dVar145 = dVar160 * -0.082785 +
                dVar145 * -0.05501625 + dVar63 * -0.8630833333333333 + dVar64 * -0.301925;
      dVar238 = dVar62 * dVar172 * dVar105;
      dVar63 = dVar95 * dVar95;
      dVar185 = 1.0 / dVar63;
      dVar108 = 1.0 / dVar169;
      dVar109 = dVar108 * dVar145;
      dVar216 = dVar109 * 0.5848223622634646 * dVar94 * dVar185 +
                dVar42 * 0.00018311447306006544 * dVar135 * dVar10 +
                (((dVar41 * 0.0005323764196666666 * dVar135 * dVar10 + dVar137 * dVar184 * dVar107)
                 - dVar257) - dVar238);
      dVar238 = dVar238 + dVar257;
      dVar257 = dVar114 * dVar90 * dVar38;
      dVar138 = dVar257 * dVar43 * 4.0;
      dVar146 = dVar91 * dVar229;
      dVar258 = dVar43 * 4.0 * dVar146;
      dVar277 = (dVar127 + dVar132) * 1.9236610509315362;
      dVar173 = dVar277 * dVar125;
      dVar147 = dVar92 * dVar14 * dVar216;
      dVar250 = 1.0 / (dVar88 * dVar88);
      dVar64 = dVar64 * 0.075 + dVar160 / -6.0;
      dVar230 = dVar57 * 0.09375;
      dVar278 = dVar228 * 0.09375;
      dVar174 = dVar49 * dVar42 * dVar9;
      dVar175 = dVar174 * 0.00018311447306006544 * dVar14 * 1.4422495703074083;
      dVar127 = dVar94 * dVar14;
      dVar186 = dVar185 * dVar109;
      dVar160 = dVar186 * 0.5848223622634646 * dVar127;
      dVar217 = ((dVar96 * dVar277 + dVar173 * dVar92 + ((dVar138 + dVar238) - dVar258) + dVar147) -
                dVar175) - dVar160;
      dVar208 = dVar36 * dVar217;
      dVar209 = dVar208 * 3.4602;
      dVar267 = dVar64 * dVar250 * dVar97;
      dVar132 = dVar267 * 3.4602;
      dVar161 = dVar58 * -0.09375;
      pdVar2 = out->vrho;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar3 = (long)(p->dim).vrho * sVar4;
        pdVar2[lVar3] =
             (((((((dVar161 - dVar48) - dVar230) - dVar278) - dVar55) - dVar60) + dVar209) - dVar132
             ) * dVar77 + dVar126 + pdVar2[lVar3];
      }
      dVar78 = -dVar78 - dVar114 * dVar44;
      dVar192 = 0.0;
      if (dVar187 < dVar115) {
        dVar192 = dVar78 * 1.3333333333333333 * dVar13;
      }
      dVar218 = dVar192 * 1.5874010519681996;
      dVar219 = dVar218 * dVar33 * dVar11;
      dVar210 = (double)(~uVar5 & (ulong)((dVar78 * dVar140) / 3.0));
      dVar189 = dVar189 + (dVar117 * dVar152 * dVar210 * dVar80) / -18.0;
      dVar220 = dVar219 * 0.09375;
      dVar239 = 0.0;
      if (dVar118 <= 1.92) {
        dVar239 = dVar189;
      }
      dVar162 = -dVar274;
      dVar221 = dVar239 * dVar274;
      dVar279 = dVar23 * dVar239 * dVar17 + (dVar221 + dVar221) * dVar130;
      dVar280 = dVar17 * dVar279 * 0.25 + dVar162 * dVar21 * dVar239 + dVar239 * dVar82 * 0.25;
      dVar189 = (double)((ulong)dVar189 & uVar7);
      if (dVar118 < 1.92) {
        dVar222 = dVar20 * -2.6666666666666665 * dVar239 + dVar280 * -2.6666666666666665 * dVar17;
      }
      else {
        dVar222 = dVar189 * dVar51 * 0.005120910384068279 +
                  dVar189 * dVar225 * -0.0056808688387635755 +
                  dVar189 * dVar100 * 0.006337888690829867 +
                  dVar189 * dVar205 * -0.007115749525616698 +
                  dVar189 * dVar99 * 0.008045977011494253 +
                  dVar189 * dVar153 * -0.009171075837742505 +
                  dVar189 * dVar170 * 0.01054945054945055 +
                  dVar189 * dVar204 * -0.012263099219620958 +
                  dVar189 * dVar214 * 0.01443001443001443 +
                  dVar189 * dVar142 * -0.01722488038277512 +
                  dVar189 * dVar203 * 0.02091503267973856 +
                  dVar189 * dVar236 * -0.025925925925925925 +
                  dVar189 * dVar182 * 0.03296703296703297 +
                  dVar189 * dVar181 * -0.04329004329004329 +
                  dVar189 * dVar155 * 0.05925925925925926 +
                  dVar189 * dVar154 * -0.08571428571428572 +
                  dVar189 * -0.2222222222222222 * dVar263 + dVar189 * dVar129 * 0.13333333333333333;
      }
      dVar193 = dVar101 * -dVar78;
      dVar268 = 0.0;
      if (dVar1 < __x) {
        dVar268 = dVar193 / 3.0;
      }
      dVar194 = -dVar227;
      dVar110 = (double)(~uVar6 & (ulong)(dVar78 * -1.3333333333333333 * dVar25));
      dVar226 = dVar226 + (dVar117 * dVar156 * dVar268 * dVar80) / -18.0;
      dVar195 = dVar110 * 1.5874010519681996;
      dVar231 = 0.0;
      if (dVar121 <= 1.92) {
        dVar231 = dVar226;
      }
      dVar163 = dVar16 * dVar222;
      dVar196 = dVar15 * dVar163 * dVar11;
      dVar197 = dVar227 * dVar231;
      dVar269 = dVar30 * dVar231 * dVar12 + (dVar197 + dVar197) * dVar275;
      dVar198 = dVar12 * dVar269 * 0.25 + dVar194 * dVar28 * dVar231 + dVar85 * dVar231 * 0.25;
      dVar199 = dVar195 * dVar123 * dVar11;
      dVar226 = (double)((ulong)dVar226 & uVar8);
      if (dVar121 < 1.92) {
        dVar270 = dVar198 * -2.6666666666666665 * dVar12 + dVar27 * -2.6666666666666665 * dVar231;
      }
      else {
        dVar270 = dVar226 * dVar56 * 0.005120910384068279 +
                  dVar226 * dVar202 * -0.0056808688387635755 +
                  dVar226 * dVar134 * 0.006337888690829867 +
                  dVar226 * dVar266 * -0.007115749525616698 +
                  dVar226 * dVar103 * 0.008045977011494253 +
                  dVar226 * dVar157 * -0.009171075837742505 +
                  dVar226 * dVar206 * 0.01054945054945055 +
                  dVar226 * dVar265 * -0.012263099219620958 +
                  dVar226 * dVar237 * 0.01443001443001443 +
                  dVar226 * dVar207 * -0.01722488038277512 +
                  dVar226 * dVar264 * 0.02091503267973856 +
                  dVar226 * dVar191 * -0.025925925925925925 +
                  dVar226 * dVar190 * 0.03296703296703297 +
                  dVar226 * dVar249 * -0.04329004329004329 +
                  dVar226 * dVar215 * 0.05925925925925926 +
                  dVar226 * dVar158 * -0.08571428571428572 +
                  dVar226 * -0.2222222222222222 * dVar276 + dVar226 * dVar143 * 0.13333333333333333;
      }
      dVar65 = dVar196 * 0.09375;
      dVar66 = dVar199 * 0.09375;
      dVar164 = dVar16 * dVar270;
      dVar281 = (dVar192 + dVar110) * 1.9236610509315362;
      dVar192 = dVar281 * dVar125;
      dVar110 = dVar120 * dVar164 * dVar11;
      dVar111 = dVar110 * 0.09375;
      dVar160 = ((dVar96 * dVar281 + dVar192 * dVar92 + ((dVar238 - dVar138) - dVar258) + dVar147) -
                dVar175) - dVar160;
      dVar138 = dVar36 * dVar160;
      dVar147 = dVar138 * 3.4602;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar3 = (long)(p->dim).vrho * sVar4;
        pdVar2[lVar3 + 1] =
             (((((((-dVar220 - dVar48) - dVar65) - dVar66) - dVar55) - dVar111) + dVar147) - dVar132
             ) * dVar77 + dVar126 + pdVar2[lVar3 + 1];
      }
      dVar267 = dVar267 * 6.9204;
      dVar175 = dVar45 * dVar45;
      dVar55 = 1.0 / (dVar77 * dVar37);
      dVar126 = dVar114 * dVar55 + dVar114 * dVar55;
      dVar238 = dVar126 - (dVar44 + dVar44);
      dVar132 = 0.0;
      dVar48 = 0.0;
      if (dVar187 < dVar115) {
        dVar48 = dVar175 * 0.4444444444444444 * dVar140 + dVar238 * 1.3333333333333333 * dVar13;
      }
      dVar258 = (local_af8 * dVar159 * dVar15 * dVar11) / 48.0;
      dVar271 = dVar116 / dVar37;
      dVar165 = dVar19 * 0.024691358024691357 * dVar271 * 1.4422495703074083 * dVar80;
      dVar240 = dVar152 * dVar141 * dVar50 * dVar80;
      dVar67 = dVar152 / dVar67;
      dVar19 = dVar140 / dVar115;
      if (dVar187 < dVar115) {
        dVar132 = dVar175 * dVar19 * -0.2222222222222222 + (dVar140 * dVar238) / 3.0;
      }
      dVar139 = (dVar132 * dVar152 * dVar117 * dVar80) / -18.0 +
                (dVar141 * dVar141 * dVar67 * dVar117 * dVar80) / 9.0 + dVar240 / 27.0 + dVar165;
      dVar261 = dVar201 / dVar261;
      dVar132 = 1.0 / (dVar81 * dVar81);
      dVar112 = dVar132 / dVar17;
      dVar282 = 1.0 / (dVar22 * dVar22);
      dVar22 = dVar272 * dVar132;
      dVar272 = (dVar132 / dVar81) * dVar272;
      local_498 = auVar242._0_8_;
      local_458 = auVar200._0_8_;
      local_368 = auVar251._0_8_;
      dStack_360 = auVar251._8_8_;
      local_488 = auVar224._0_8_;
      dStack_480 = auVar224._8_8_;
      local_428 = auVar149._0_8_;
      dStack_420 = auVar149._8_8_;
      local_468 = auVar211._0_8_;
      dStack_460 = auVar211._8_8_;
      if (dVar118 < 1.92) {
        dVar81 = dVar213 * dVar213;
        dVar139 = (double)(~uVar7 & (ulong)dVar139);
        dVar81 = ((dVar81 * dVar282 * 4.0 * dVar272 +
                  dVar81 * dVar274 * -6.0 * dVar22 +
                  (dVar274 * dVar139 + dVar274 * dVar139) * dVar130 +
                  dVar81 * dVar274 * 8.0 * dVar21 + dVar23 * dVar139 * dVar17 + dVar23 * dVar81) *
                  dVar17 * 0.25 +
                 dVar82 * dVar139 * 0.25 +
                 ((dVar21 * dVar139 * dVar162 + dVar246 * dVar81 * (dVar274 + dVar274)) -
                 dVar112 * (dVar282 + dVar282) * dVar81) + dVar168 * dVar213 * 0.5) *
                 -2.6666666666666665 * dVar17 +
                 dVar20 * -2.6666666666666665 * dVar139 + dVar248 * -5.333333333333333 * dVar213;
      }
      else {
        dVar139 = (double)((ulong)dVar139 & uVar7);
        dVar81 = dVar98 * dVar98;
        dVar81 = local_498 * dVar81 * -0.42857142857142855 +
                 dVar253 * dVar81 * 0.47619047619047616 +
                 dVar24 * dVar81 * -0.5333333333333333 +
                 dVar119 * dVar81 * 0.6 +
                 dVar178 * -(dVar81 * 0.6666666666666666) +
                 dVar83 * dVar81 * 0.6666666666666666 +
                 dVar170 * dVar139 * 0.01054945054945055 +
                 dVar204 * dVar139 * -0.012263099219620958 +
                 dVar214 * dVar139 * 0.01443001443001443 +
                 dVar142 * dVar139 * -0.01722488038277512 +
                 dVar203 * dVar139 * 0.02091503267973856 +
                 dVar236 * dVar139 * -0.025925925925925925 +
                 dVar182 * dVar139 * 0.03296703296703297 +
                 dVar181 * dVar139 * -0.04329004329004329 +
                 dVar155 * dVar139 * 0.05925925925925926 +
                 dVar154 * dVar139 * -0.08571428571428572 +
                 dVar263 * dVar139 * -0.2222222222222222 + dVar129 * dVar139 * 0.13333333333333333 +
                 dVar51 * dVar139 * 0.005120910384068279 +
                 dVar225 * dVar139 * -0.0056808688387635755 +
                 dVar100 * dVar139 * 0.006337888690829867 +
                 dVar205 * dVar139 * -0.007115749525616698 +
                 dVar99 * dVar139 * 0.008045977011494253 +
                 dVar153 * dVar139 * -0.009171075837742505 +
                 dVar261 * dVar81 * -0.18947368421052632 +
                 dStack_460 * dVar81 * 0.19883040935672514 +
                 local_468 * dVar81 * -0.20915032679738563 +
                 dVar201 * dVar81 * 0.22058823529411764 +
                 local_458 * dVar81 * -0.23333333333333334 +
                 dStack_420 * dVar81 * 0.24761904761904763 +
                 local_428 * dVar81 * -0.26373626373626374 +
                 dStack_480 * dVar81 * 0.28205128205128205 +
                 local_488 * dVar81 * -0.30303030303030304 +
                 dStack_360 * dVar81 * 0.32727272727272727 +
                 dVar245 * dVar81 * 0.3888888888888889 + local_368 * dVar81 * -0.35555555555555557;
      }
      dVar132 = 0.0;
      dVar139 = 0.0;
      if (dVar1 < __x) {
        dVar139 = dVar175 * 0.4444444444444444 * dVar101 + dVar238 * -1.3333333333333333 * dVar25;
      }
      dVar180 = (dVar159 * dVar180 * dVar120 * dVar11) / 48.0;
      dVar232 = dVar271 * 1.4422495703074083 * dVar26 * 0.024691358024691357 * dVar80;
      dVar159 = dVar156 * dVar183 * dVar50 * dVar80;
      dVar113 = dVar156 / dVar113;
      dVar26 = dVar101 / __x;
      if (dVar1 < __x) {
        dVar132 = dVar175 * dVar26 * -0.2222222222222222 + (-dVar238 * dVar101) / 3.0;
      }
      dVar175 = (dVar132 * dVar156 * dVar117 * dVar80) / -18.0 +
                (dVar183 * dVar183 * dVar113 * dVar117 * dVar80) / 9.0 + dVar159 / 27.0 + dVar232;
      dVar262 = dVar235 / dVar262;
      dVar259 = 1.0 / (dVar84 * dVar84);
      dVar132 = dVar259 / dVar12;
      dVar29 = 1.0 / (dVar29 * dVar29);
      dVar238 = dVar273 * dVar259;
      dVar273 = (dVar259 / dVar84) * dVar273;
      local_3a8 = auVar68._0_8_;
      local_3f8 = auVar70._0_8_;
      local_418 = auVar150._0_8_;
      dStack_410 = auVar150._8_8_;
      local_5f8 = auVar72._0_8_;
      dStack_5f0 = auVar72._8_8_;
      local_3c8 = auVar69._0_8_;
      dStack_3c0 = auVar69._8_8_;
      local_5e8 = auVar71._0_8_;
      dStack_5e0 = auVar71._8_8_;
      if (dVar121 < 1.92) {
        dVar84 = dVar171 * dVar171;
        dVar175 = (double)(~uVar8 & (ulong)dVar175);
        dVar84 = ((dVar29 * dVar84 * 4.0 * dVar273 +
                  (dVar227 * dVar175 + dVar227 * dVar175) * dVar275 +
                  dVar227 * dVar84 * -6.0 * dVar238 +
                  dVar84 * dVar30 + dVar30 * dVar175 * dVar12 + dVar227 * 8.0 * dVar84 * dVar28) *
                  dVar12 * 0.25 +
                 dVar85 * dVar175 * 0.25 +
                 ((dVar28 * dVar175 * dVar194 + dVar254 * dVar84 * (dVar227 + dVar227)) -
                 dVar132 * (dVar29 + dVar29) * dVar84) + dVar188 * dVar171 * 0.5) *
                 -2.6666666666666665 * dVar12 +
                 dVar27 * -2.6666666666666665 * dVar175 + dVar256 * -5.333333333333333 * dVar171;
      }
      else {
        dVar84 = dVar102 * dVar102;
        dVar175 = (double)((ulong)dVar175 & uVar8);
        dVar84 = dVar175 * dVar206 * 0.01054945054945055 +
                 dVar175 * dVar265 * -0.012263099219620958 +
                 dVar175 * dVar237 * 0.01443001443001443 +
                 dVar175 * dVar207 * -0.01722488038277512 +
                 dVar175 * dVar264 * 0.02091503267973856 +
                 dVar175 * dVar191 * -0.025925925925925925 +
                 dVar175 * dVar190 * 0.03296703296703297 +
                 dVar175 * dVar249 * -0.04329004329004329 +
                 dVar175 * dVar215 * 0.05925925925925926 +
                 dVar175 * dVar158 * -0.08571428571428572 +
                 dVar175 * dVar143 * 0.13333333333333333 +
                 dVar276 * dVar175 * -0.2222222222222222 +
                 dVar56 * dVar175 * 0.005120910384068279 +
                 dVar202 * dVar175 * -0.0056808688387635755 +
                 dVar134 * dVar175 * 0.006337888690829867 +
                 dVar266 * dVar175 * -0.007115749525616698 +
                 dVar175 * dVar157 * -0.009171075837742505 +
                 dVar103 * dVar175 * 0.008045977011494253 +
                 dVar262 * dVar84 * -0.18947368421052632 +
                 dStack_5e0 * dVar84 * 0.19883040935672514 +
                 local_5e8 * dVar84 * -0.20915032679738563 +
                 dVar235 * dVar84 * 0.22058823529411764 +
                 local_3f8 * dVar84 * -0.23333333333333334 +
                 dStack_3c0 * dVar84 * 0.24761904761904763 +
                 local_3c8 * dVar84 * -0.26373626373626374 +
                 dStack_5f0 * dVar84 * 0.28205128205128205 +
                 local_5f8 * dVar84 * -0.30303030303030304 +
                 dStack_410 * dVar84 * 0.32727272727272727 +
                 local_418 * dVar84 * -0.35555555555555557 +
                 dVar167 * dVar84 * 0.3888888888888889 +
                 local_3a8 * dVar84 * -0.42857142857142855 +
                 dVar179 * dVar84 * 0.47619047619047616 +
                 dVar31 * dVar84 * -0.5333333333333333 +
                 dVar122 * dVar84 * 0.6 +
                 dVar86 * dVar84 * 0.6666666666666666 + dVar212 * -(dVar84 * 0.6666666666666666);
      }
      dVar175 = 1.0 / (dVar63 * dVar63);
      dVar145 = dVar145 * dVar145;
      dVar169 = 1.0 / (dVar169 * dVar169);
      dVar79 = dVar79 * 1.5874010519681996 * (dVar87 / dVar37);
      dVar148 = ((2.080083823051904 / local_df0) / dVar151) * dVar79;
      dVar241 = (1.4422495703074083 / local_df0) * dVar9 * dVar271;
      dVar259 = dVar271 * 2.519842099789747;
      dVar166 = dVar10 * dVar259;
      if (dVar151 < 0.0) {
        dVar151 = sqrt(dVar151);
      }
      else {
        dVar151 = SQRT(dVar151);
      }
      dVar79 = dVar79 * (1.0 / dVar151) * 2.080083823051904;
      dVar136 = dVar9 * dVar271 * dVar136 * 1.4422495703074083;
      dVar124 = dVar124 * (dVar87 / dVar37) * 1.5874010519681996;
      dVar151 = dVar172 * dVar105 * dVar105;
      dVar223 = (dVar151 + dVar151) * (1.0 / (dVar89 * dVar61)) * dVar32;
      dVar62 = dVar62 * (dVar124 * 0.1369277777777778 +
                        dVar136 * 0.13651666666666668 +
                        dVar79 * 0.06825833333333334 +
                        dVar166 * 0.3986222222222222 +
                        dVar148 * -0.4219833333333333 + dVar241 * 0.8439666666666666) * dVar172;
      dVar283 = (1.0 / (dVar34 * dVar34)) * dVar105 * dVar105 * 16.081979498692537 *
                (1.0 / (dVar61 * dVar61)) * dVar32;
      dVar63 = 1.0 / (dVar95 * dVar63);
      dVar233 = (dVar124 * 0.137975 +
                dVar136 * 0.073355 +
                dVar79 * 0.0366775 +
                dVar166 * 0.4025666666666667 +
                dVar148 * -0.5753888888888888 + dVar241 * 1.1507777777777777) * dVar108;
      dVar34 = dVar35 * 0.0014764627977777779 * dVar259 * dVar10;
      dVar105 = dVar172 * dVar105 * 0.035616666666666665 * (1.0 / dVar61) * dVar49 * dVar11;
      dVar35 = dVar175 * dVar145 * dVar169 * 17.315859105681465 * dVar127;
      dVar95 = dVar185 * dVar233 * 0.5848223622634646 * dVar127;
      dVar127 = dVar108 * dVar145 * dVar63 * 1.1696447245269292 * dVar127;
      dVar32 = dVar135 * dVar186 * 0.01084358130030174 * dVar10 * dVar14;
      dVar9 = dVar14 * 1.4422495703074083 * dVar9 * dVar271 * dVar42 * 0.00024415263074675396;
      dVar89 = dVar43 * 12.0 * dVar90 * dVar38;
      dVar61 = dVar43 * 32.0 * dVar114 * dVar90 * dVar229;
      dVar135 = dVar46 * dVar128 * dVar11;
      dVar90 = dVar131 * dVar87 * dVar15 * dVar11;
      dVar131 = dVar53 * dVar133 * dVar11;
      dVar151 = dVar144 * dVar87 * dVar120 * dVar11;
      dVar47 = dVar47 * 0.0625;
      dVar54 = dVar54 * 0.0625;
      dVar144 = dVar94 * dVar277 * dVar186;
      dVar41 = (dVar169 * dVar145 * 17.315859105681465 * dVar175 * dVar94 +
               dVar233 * 0.5848223622634646 * dVar94 * dVar185 +
               dVar108 * dVar145 * -1.1696447245269292 * dVar94 * dVar63 +
               dVar109 * -0.01084358130030174 * dVar49 * dVar185 * dVar11 +
               dVar42 * -0.00024415263074675396 * dVar259 * dVar10 +
               ((((1.0 / (dVar40 * dVar40)) * dVar107 * dVar107 * 32.16395899738507 *
                  (1.0 / (dVar106 * dVar106)) * dVar39 +
                  (dVar124 * 0.17365833333333333 +
                  dVar136 * 0.2805166666666667 +
                  dVar79 * 0.14025833333333335 +
                  dVar166 * 0.6886333333333333 +
                  dVar148 * -0.7843833333333333 + dVar241 * 1.5687666666666666) * dVar184 * dVar137
                  + dVar184 * dVar107 * dVar107 * -2.0 * (1.0 / (dVar93 * dVar106)) * dVar39 +
                    dVar41 * -0.0007098352262222222 * dVar259 * dVar10 +
                    dVar184 * dVar107 * -0.03424666666666667 * (1.0 / dVar106) * dVar49 * dVar11 +
                  dVar34 + dVar105 + dVar223) - dVar62) - dVar283)) * dVar14 * dVar92;
      dVar40 = (dVar48 + dVar139) * 1.9236610509315362;
      dVar42 = dVar277 * dVar216 * dVar92;
      dVar10 = dVar43 * 20.0 * dVar91 * (dVar38 / dVar37);
      dVar37 = dVar14 * dVar216 * 8.0;
      dVar14 = dVar146 * dVar37;
      dVar37 = dVar37 * dVar257;
      dVar79 = dVar277 * 1.4422495703074083 * dVar174;
      dVar38 = dVar217 * dVar250 * dVar64;
      dVar39 = dVar64 * dVar64 * (dVar250 / dVar88) * dVar97 * 6.9204;
      dVar169 = (dVar166 * -0.1 + dVar124 * 0.2777777777777778) * dVar250 * dVar97 * 3.4602;
      pdVar2 = out->v2rho2;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar3 = (long)(p->dim).v2rho2 * sVar4;
        pdVar2[lVar3] =
             (((((((((((((((dVar48 * 1.5874010519681996 * dVar33 * dVar11 * -0.09375 -
                           dVar135 * 0.0625) - dVar46 * dVar52 * dVar11 * 0.1875) + dVar258) -
                        dVar90 * 0.0625) - dVar81 * dVar16 * dVar15 * dVar11 * 0.09375) -
                      dVar139 * 1.5874010519681996 * dVar123 * dVar11 * 0.09375) - dVar131 * 0.0625)
                    - dVar53 * dVar59 * dVar11 * 0.1875) + dVar180) - dVar151 * 0.0625) -
                 dVar84 * dVar16 * dVar120 * dVar11 * 0.09375) +
                (((((((dVar79 * -0.0003662289461201309 +
                      ((dVar173 * dVar257 * 8.0 + dVar37) - dVar223) + dVar127) - dVar105) + dVar32
                    + dVar9) - dVar34) + dVar89) - dVar61) + dVar10 +
                dVar40 * dVar96 +
                ((dVar146 * dVar173 * -8.0 +
                 dVar42 + dVar42 +
                 dVar125 * dVar40 * dVar92 +
                 dVar144 * -1.1696447245269292 + (-dVar35 - dVar95) + dVar41) - dVar14) + dVar62 +
                dVar283) * dVar36 * 3.4602) - dVar38 * 6.9204) + dVar39) - dVar169) * dVar77 +
             ((dVar208 * 6.9204 +
              dVar104 * -0.1875 +
              ((dVar228 * -0.1875 + dVar57 * -0.1875 + (dVar58 * -0.1875 - dVar47)) - dVar54)) -
             dVar267) + pdVar2[lVar3];
      }
      dVar84 = 0.0;
      dVar81 = 0.0;
      if (dVar187 < dVar115) {
        dVar81 = dVar45 * 0.4444444444444444 * dVar78 * dVar140 +
                 dVar55 * 2.6666666666666665 * dVar114 * dVar13;
      }
      dVar40 = dVar152 * dVar210 * dVar50 * dVar80;
      dVar18 = dVar18 * p->cam_omega * 1.4422495703074083;
      if (dVar187 < dVar115) {
        dVar84 = dVar55 * 0.6666666666666666 * dVar114 * dVar140 +
                 dVar45 * -0.2222222222222222 * dVar78 * dVar19;
      }
      dVar84 = (dVar84 * dVar152 * dVar117 * dVar80) / -18.0 +
               (dVar141 * dVar210 * dVar116 * dVar67 * dVar18) / 9.0 +
               dVar40 / 54.0 + dVar240 / 54.0 + dVar165;
      if (dVar118 < 1.92) {
        dVar84 = (double)(~uVar7 & (ulong)dVar84);
        dVar168 = dVar248 * -2.6666666666666665 * dVar239 +
                  dVar280 * -2.6666666666666665 * dVar213 +
                  dVar20 * -2.6666666666666665 * dVar84 +
                  ((dVar247 * 8.0 * dVar21 * dVar239 +
                   dVar239 * dVar282 * dVar213 * 4.0 * dVar272 +
                   (dVar274 * dVar84 + dVar274 * dVar84) * dVar130 +
                   dVar221 * dVar213 * -6.0 * dVar22 +
                   dVar23 * dVar84 * dVar17 + dVar23 * dVar239 * dVar213) * dVar17 * 0.25 +
                  dVar84 * dVar82 * 0.25 +
                  dVar21 * dVar84 * dVar162 + dVar239 * dVar246 * (dVar247 + dVar247) +
                  dVar239 * dVar112 * dVar213 * dVar282 * -2.0 + dVar168 * dVar239 * 0.25 +
                  dVar279 * dVar213 * 0.25) * -2.6666666666666665 * dVar17;
      }
      else {
        dVar84 = (double)((ulong)dVar84 & uVar7);
        dVar168 = dVar100 * dVar84 * 0.006337888690829867 +
                  dVar205 * dVar84 * -0.007115749525616698 +
                  dVar99 * dVar84 * 0.008045977011494253 +
                  dVar153 * dVar84 * -0.009171075837742505 +
                  dVar170 * dVar84 * 0.01054945054945055 +
                  dVar204 * dVar84 * -0.012263099219620958 +
                  dVar214 * dVar84 * 0.01443001443001443 +
                  dVar142 * dVar84 * -0.01722488038277512 +
                  dVar203 * dVar84 * 0.02091503267973856 +
                  dVar236 * dVar84 * -0.025925925925925925 +
                  dVar182 * dVar84 * 0.03296703296703297 +
                  dVar181 * dVar84 * -0.04329004329004329 +
                  dVar84 * dVar155 * 0.05925925925925926 +
                  dVar84 * dVar154 * -0.08571428571428572 +
                  dVar129 * dVar84 * 0.13333333333333333 +
                  dVar263 * dVar84 * -0.2222222222222222 +
                  dVar225 * dVar84 * -0.0056808688387635755 + dVar51 * dVar84 * 0.005120910384068279
                  + dVar189 * local_458 * dVar98 * -0.23333333333333334 +
                    dStack_420 * dVar189 * dVar98 * 0.24761904761904763 +
                    dVar189 * local_428 * dVar98 * -0.26373626373626374 +
                    dStack_480 * dVar189 * dVar98 * 0.28205128205128205 +
                    dVar189 * local_488 * dVar98 * -0.30303030303030304 +
                    dStack_360 * dVar189 * dVar98 * 0.32727272727272727 +
                    dVar189 * local_368 * dVar98 * -0.35555555555555557 +
                    dVar245 * dVar189 * dVar98 * 0.3888888888888889 +
                    dVar189 * local_498 * dVar98 * -0.42857142857142855 +
                    dVar189 * dVar253 * dVar98 * 0.47619047619047616 +
                    dVar189 * dVar24 * dVar98 * -0.5333333333333333 +
                    dVar189 * dVar119 * dVar98 * 0.6 +
                    -(dVar98 * 0.6666666666666666) * dVar178 * dVar189 +
                    dVar98 * 0.6666666666666666 * dVar83 * dVar189 +
                    dVar189 * dVar261 * dVar98 * -0.18947368421052632 +
                    dStack_460 * dVar189 * dVar98 * 0.19883040935672514 +
                    dVar201 * dVar189 * dVar98 * 0.22058823529411764 +
                    dVar189 * local_468 * dVar98 * -0.20915032679738563;
      }
      dVar43 = 0.0;
      dVar84 = 0.0;
      if (dVar1 < __x) {
        dVar84 = dVar45 * -0.4444444444444444 * dVar193 +
                 dVar55 * -2.6666666666666665 * dVar114 * dVar25;
      }
      dVar124 = dVar50 * dVar156 * dVar268 * dVar80;
      if (dVar1 < __x) {
        dVar43 = dVar55 * -0.6666666666666666 * dVar114 * dVar101 +
                 dVar45 * 0.2222222222222222 * -dVar78 * dVar26;
      }
      dVar114 = (dVar43 * dVar156 * dVar117 * dVar80) / -18.0 +
                (dVar116 * dVar113 * dVar183 * dVar268 * dVar18) / 9.0 +
                dVar124 / 54.0 + dVar159 / 54.0 + dVar232;
      if (dVar121 < 1.92) {
        dVar114 = (double)(~uVar8 & (ulong)dVar114);
        local_958 = dVar256 * -2.6666666666666665 * dVar231 +
                    dVar198 * -2.6666666666666665 * dVar171 +
                    dVar27 * -2.6666666666666665 * dVar114 +
                    ((dVar255 * 8.0 * dVar28 * dVar231 +
                     (dVar227 * dVar114 + dVar227 * dVar114) * dVar275 +
                     dVar231 * dVar29 * dVar171 * 4.0 * dVar273 +
                     dVar197 * dVar171 * -6.0 * dVar238 +
                     dVar30 * dVar114 * dVar12 + dVar30 * dVar231 * dVar171) * dVar12 * 0.25 +
                    dVar114 * dVar85 * 0.25 +
                    dVar28 * dVar114 * dVar194 + dVar254 * dVar231 * (dVar255 + dVar255) +
                    dVar132 * dVar231 * dVar171 * dVar29 * -2.0 + dVar188 * dVar231 * 0.25 +
                    dVar269 * dVar171 * 0.25) * -2.6666666666666665 * dVar12;
      }
      else {
        dVar114 = (double)((ulong)dVar114 & uVar8);
        local_958 = dVar134 * dVar114 * 0.006337888690829867 +
                    dVar266 * dVar114 * -0.007115749525616698 +
                    dVar103 * dVar114 * 0.008045977011494253 +
                    dVar157 * dVar114 * -0.009171075837742505 +
                    dVar206 * dVar114 * 0.01054945054945055 +
                    dVar265 * dVar114 * -0.012263099219620958 +
                    dVar237 * dVar114 * 0.01443001443001443 +
                    dVar207 * dVar114 * -0.01722488038277512 +
                    dVar114 * dVar264 * 0.02091503267973856 +
                    dVar114 * dVar191 * -0.025925925925925925 +
                    dVar190 * dVar114 * 0.03296703296703297 +
                    dVar249 * dVar114 * -0.04329004329004329 +
                    dVar215 * dVar114 * 0.05925925925925926 +
                    dVar158 * dVar114 * -0.08571428571428572 +
                    dVar143 * dVar114 * 0.13333333333333333 +
                    dVar276 * dVar114 * -0.2222222222222222 +
                    dVar202 * dVar114 * -0.0056808688387635755 +
                    dVar56 * dVar114 * 0.005120910384068279 +
                    dVar226 * local_5f8 * dVar102 * -0.30303030303030304 +
                    dStack_410 * dVar226 * dVar102 * 0.32727272727272727 +
                    dVar226 * local_418 * dVar102 * -0.35555555555555557 +
                    dVar167 * dVar226 * dVar102 * 0.3888888888888889 +
                    dVar226 * local_3a8 * dVar102 * -0.42857142857142855 +
                    dVar226 * dVar179 * dVar102 * 0.47619047619047616 +
                    dVar226 * dVar31 * dVar102 * -0.5333333333333333 +
                    dVar226 * dVar122 * dVar102 * 0.6 +
                    -(dVar102 * 0.6666666666666666) * dVar212 * dVar226 +
                    dVar102 * 0.6666666666666666 * dVar226 * dVar86 +
                    dVar226 * dVar262 * dVar102 * -0.18947368421052632 +
                    dStack_5e0 * dVar226 * dVar102 * 0.19883040935672514 +
                    dVar226 * local_5e8 * dVar102 * -0.20915032679738563 +
                    dVar235 * dVar226 * dVar102 * 0.22058823529411764 +
                    dVar226 * local_3f8 * dVar102 * -0.23333333333333334 +
                    dStack_3c0 * dVar226 * dVar102 * 0.24761904761904763 +
                    dStack_5f0 * dVar226 * dVar102 * 0.28205128205128205 +
                    dVar226 * local_3c8 * dVar102 * -0.26373626373626374;
      }
      dVar186 = dVar94 * dVar281 * dVar186;
      dVar188 = (dVar81 + dVar84) * 1.9236610509315362;
      dVar174 = dVar281 * 1.4422495703074083 * dVar174;
      dVar18 = dVar216 * dVar281 * dVar92;
      dVar64 = dVar64 * dVar250 * dVar160;
      dVar43 = dVar128 * dVar218 * dVar11;
      dVar88 = dVar222 * dVar87 * dVar15 * dVar11;
      dVar116 = dVar133 * dVar195 * dVar11;
      dVar114 = dVar270 * dVar87 * dVar120 * dVar11;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar3 = (long)(p->dim).v2rho2 * sVar4;
        pdVar2[lVar3 + 1] =
             (((dVar38 * -3.4602 +
                dVar64 * -3.4602 +
                (((dVar146 * dVar173 * -4.0 +
                  dVar42 + ((dVar79 * -0.00018311447306006544 +
                             ((dVar174 * -0.00018311447306006544 +
                               dVar173 * dVar257 * -4.0 + (dVar10 - dVar89) + dVar9) - dVar105) +
                             dVar32 + dVar41) - dVar34)) - dVar14) +
                dVar125 * dVar188 * dVar92 +
                dVar146 * dVar192 * -4.0 +
                dVar257 * dVar192 * 4.0 +
                dVar186 * -0.5848223622634646 +
                (((((dVar188 * dVar96 + dVar144 * -0.5848223622634646) - dVar35) - dVar95) + dVar62
                 + dVar283) - dVar223) + dVar127 + dVar18) * dVar36 * 3.4602 +
                local_958 * dVar16 * dVar120 * dVar11 * -0.09375 +
                dVar114 * -0.03125 +
                dVar53 * dVar164 * dVar11 * -0.09375 +
                dVar151 * -0.03125 +
                dVar59 * dVar195 * dVar11 * -0.09375 + dVar131 * -0.03125 + dVar180 + dVar39) -
              dVar169) +
             dVar116 * -0.03125 +
             dVar84 * 1.5874010519681996 * dVar123 * dVar11 * -0.09375 +
             dVar168 * dVar16 * dVar15 * dVar11 * -0.09375 +
             dVar88 * -0.03125 +
             dVar46 * dVar163 * dVar11 * -0.09375 +
             dVar90 * -0.03125 +
             dVar135 * -0.03125 +
             dVar52 * dVar218 * dVar11 * -0.09375 +
             dVar81 * 1.5874010519681996 * dVar33 * dVar11 * -0.09375 + dVar43 * -0.03125 + dVar258)
             * dVar77 +
             dVar147 + (((((((((((dVar161 - dVar47) - dVar230) - dVar278) - dVar54) - dVar60) +
                            dVar209) - dVar267) - dVar220) - dVar65) - dVar66) - dVar111) +
             pdVar2[lVar3 + 1];
      }
      dVar78 = dVar78 * dVar78;
      dVar126 = dVar44 + dVar44 + dVar126;
      dVar79 = 0.0;
      dVar81 = 0.0;
      if (dVar187 < dVar115) {
        dVar81 = dVar78 * 0.4444444444444444 * dVar140 + dVar13 * dVar126 * 1.3333333333333333;
      }
      if (dVar187 < dVar115) {
        dVar79 = dVar19 * dVar78 * -0.2222222222222222 + (dVar140 * dVar126) / 3.0;
      }
      dVar187 = (dVar152 * dVar79 * dVar117 * dVar80) / -18.0 +
                (dVar67 * dVar210 * dVar210 * dVar117 * dVar80) / 9.0 + dVar165 + dVar40 / 27.0;
      if (dVar118 < 1.92) {
        dVar187 = (double)(~uVar7 & (ulong)dVar187);
        dVar13 = dVar239 * dVar239;
        dVar187 = ((dVar282 * dVar13 * 4.0 * dVar272 +
                   (dVar274 * dVar187 + dVar274 * dVar187) * dVar130 +
                   dVar13 * dVar274 * -6.0 * dVar22 +
                   dVar13 * dVar23 + dVar23 * dVar187 * dVar17 + dVar274 * 8.0 * dVar13 * dVar21) *
                   dVar17 * 0.25 +
                  dVar82 * dVar187 * 0.25 +
                  ((dVar162 * dVar21 * dVar187 + dVar246 * dVar13 * (dVar274 + dVar274)) -
                  (dVar282 + dVar282) * dVar112 * dVar13) + dVar279 * dVar239 * 0.5) *
                  -2.6666666666666665 * dVar17 +
                  dVar20 * -2.6666666666666665 * dVar187 + dVar280 * -5.333333333333333 * dVar239;
      }
      else {
        dVar187 = (double)(uVar7 & (ulong)dVar187);
        dVar189 = dVar189 * dVar189;
        dVar187 = dVar187 * dVar51 * 0.005120910384068279 +
                  dVar187 * dVar225 * -0.0056808688387635755 +
                  dVar187 * dVar100 * 0.006337888690829867 +
                  dVar187 * dVar205 * -0.007115749525616698 +
                  dVar187 * dVar99 * 0.008045977011494253 +
                  dVar187 * dVar153 * -0.009171075837742505 +
                  dVar187 * dVar170 * 0.01054945054945055 +
                  dVar187 * dVar204 * -0.012263099219620958 +
                  dVar187 * dVar214 * 0.01443001443001443 +
                  dVar187 * dVar142 * -0.01722488038277512 +
                  dVar187 * dVar203 * 0.02091503267973856 +
                  dVar187 * dVar236 * -0.025925925925925925 +
                  dVar187 * dVar182 * 0.03296703296703297 +
                  dVar187 * dVar181 * -0.04329004329004329 +
                  dVar187 * dVar155 * 0.05925925925925926 +
                  dVar187 * dVar154 * -0.08571428571428572 +
                  dVar263 * dVar187 * -0.2222222222222222 + dVar187 * dVar129 * 0.13333333333333333
                  + dVar119 * dVar189 * 0.6 +
                    dVar178 * dVar189 * -0.6666666666666666 +
                    dVar83 * dVar189 * 0.6666666666666666 +
                    dVar261 * dVar189 * -0.18947368421052632 +
                    dStack_460 * dVar189 * 0.19883040935672514 +
                    local_468 * dVar189 * -0.20915032679738563 +
                    dVar201 * dVar189 * 0.22058823529411764 +
                    local_458 * dVar189 * -0.23333333333333334 +
                    dStack_420 * dVar189 * 0.24761904761904763 +
                    local_428 * dVar189 * -0.26373626373626374 +
                    dStack_480 * dVar189 * 0.28205128205128205 +
                    local_488 * dVar189 * -0.30303030303030304 +
                    dStack_360 * dVar189 * 0.32727272727272727 +
                    local_368 * dVar189 * -0.35555555555555557 +
                    dVar245 * dVar189 * 0.3888888888888889 +
                    local_498 * dVar189 * -0.42857142857142855 +
                    dVar24 * dVar189 * -0.5333333333333333 + dVar253 * dVar189 * 0.47619047619047616
        ;
      }
      dVar13 = 0.0;
      dVar115 = 0.0;
      if (dVar1 < __x) {
        dVar115 = dVar78 * 0.4444444444444444 * dVar101 + dVar126 * -1.3333333333333333 * dVar25;
      }
      if (dVar1 < __x) {
        dVar13 = dVar78 * dVar26 * -0.2222222222222222 + (dVar101 * -dVar126) / 3.0;
      }
      dVar13 = (dVar156 * dVar13 * dVar117 * dVar80) / -18.0 +
               (dVar113 * dVar268 * dVar268 * dVar117 * dVar80) / 9.0 + dVar232 + dVar124 / 27.0;
      if (dVar121 < 1.92) {
        dVar13 = (double)(~uVar8 & (ulong)dVar13);
        dVar78 = dVar231 * dVar231;
        dVar12 = (((dVar227 * dVar13 + dVar227 * dVar13) * dVar275 +
                  dVar78 * dVar30 +
                  dVar29 * dVar78 * 4.0 * dVar273 +
                  dVar227 * dVar78 * -6.0 * dVar238 +
                  dVar30 * dVar13 * dVar12 + dVar227 * 8.0 * dVar78 * dVar28) * dVar12 * 0.25 +
                 dVar85 * dVar13 * 0.25 +
                 ((dVar194 * dVar28 * dVar13 + (dVar227 + dVar227) * dVar254 * dVar78) -
                 (dVar29 + dVar29) * dVar132 * dVar78) + dVar269 * dVar231 * 0.5) *
                 -2.6666666666666665 * dVar12 +
                 dVar27 * -2.6666666666666665 * dVar13 + dVar198 * -5.333333333333333 * dVar231;
      }
      else {
        dVar13 = (double)(uVar8 & (ulong)dVar13);
        dVar226 = dVar226 * dVar226;
        dVar12 = dVar13 * dVar56 * 0.005120910384068279 +
                 dVar13 * dVar202 * -0.0056808688387635755 +
                 dVar13 * dVar134 * 0.006337888690829867 +
                 dVar266 * dVar13 * -0.007115749525616698 +
                 dVar103 * dVar13 * 0.008045977011494253 +
                 dVar13 * dVar157 * -0.009171075837742505 +
                 dVar13 * dVar206 * 0.01054945054945055 +
                 dVar13 * dVar265 * -0.012263099219620958 +
                 dVar13 * dVar237 * 0.01443001443001443 +
                 dVar13 * dVar207 * -0.01722488038277512 +
                 dVar13 * dVar264 * 0.02091503267973856 +
                 dVar13 * dVar191 * -0.025925925925925925 +
                 dVar13 * dVar190 * 0.03296703296703297 +
                 dVar13 * dVar249 * -0.04329004329004329 +
                 dVar13 * dVar215 * 0.05925925925925926 +
                 dVar13 * dVar158 * -0.08571428571428572 +
                 dVar276 * dVar13 * -0.2222222222222222 + dVar13 * dVar143 * 0.13333333333333333 +
                 local_3a8 * dVar226 * -0.42857142857142855 +
                 dVar179 * dVar226 * 0.47619047619047616 +
                 dVar31 * dVar226 * -0.5333333333333333 +
                 dVar122 * dVar226 * 0.6 +
                 dVar212 * dVar226 * -0.6666666666666666 +
                 dVar86 * dVar226 * 0.6666666666666666 +
                 dVar262 * dVar226 * -0.18947368421052632 +
                 dStack_5e0 * dVar226 * 0.19883040935672514 +
                 local_5e8 * dVar226 * -0.20915032679738563 +
                 dVar235 * dVar226 * 0.22058823529411764 +
                 local_3f8 * dVar226 * -0.23333333333333334 +
                 dStack_3c0 * dVar226 * 0.24761904761904763 +
                 local_3c8 * dVar226 * -0.26373626373626374 +
                 dStack_5f0 * dVar226 * 0.28205128205128205 +
                 local_5f8 * dVar226 * -0.30303030303030304 +
                 dStack_410 * dVar226 * 0.32727272727272727 +
                 dVar167 * dVar226 * 0.3888888888888889 + local_418 * dVar226 * -0.35555555555555557
        ;
      }
      dVar13 = (dVar81 + dVar115) * 1.9236610509315362;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 4) != 0)) {
        lVar3 = (long)(p->dim).v2rho2 * sVar4;
        pdVar2[lVar3 + 2] =
             ((dVar39 + ((dVar36 * (dVar10 + dVar61 + dVar89 + ((dVar9 + dVar32 + ((dVar127 +
                                                                                   dVar174 * 
                                                  -0.0003662289461201309 +
                                                  ((dVar283 - dVar37) - dVar223)) - dVar105)) -
                                                  dVar34) +
                                   dVar62 + ((dVar41 + (((dVar146 * dVar192 * -8.0 +
                                                         dVar257 * dVar192 * -8.0 +
                                                         dVar18 + dVar18 +
                                                         dVar186 * -1.1696447245269292 +
                                                         dVar125 * dVar13 * dVar92 + dVar96 * dVar13
                                                         ) - dVar35) - dVar95)) - dVar14)) * 3.4602
                         + ((dVar180 +
                            ((((((dVar258 +
                                 ((dVar33 * dVar81 * 1.5874010519681996 * dVar11 * -0.09375 -
                                  dVar43 * 0.0625) - dVar218 * dVar163 * dVar11 * 0.1875)) -
                                dVar88 * 0.0625) - dVar15 * dVar187 * dVar16 * dVar11 * 0.09375) -
                              dVar123 * dVar115 * 1.5874010519681996 * dVar11 * 0.09375) -
                             dVar116 * 0.0625) - dVar195 * dVar164 * dVar11 * 0.1875)) -
                           dVar114 * 0.0625) + dVar120 * dVar16 * dVar12 * dVar11 * -0.09375) -
                        dVar64 * 6.9204)) - dVar169) * dVar77 +
             ((dVar138 * 6.9204 +
              dVar110 * -0.1875 +
              ((dVar199 * -0.1875 + dVar196 * -0.1875 + dVar219 * -0.1875 + -dVar47) - dVar54)) -
             dVar267) + pdVar2[lVar3 + 2];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}